

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es2fDepthStencilTests.cpp
# Opt level: O3

void deqp::gles2::Functional::DepthStencilCaseUtil::generateBaseClearAndDepthCommands
               (TestRenderTarget *target,
               vector<deqp::gles2::Functional::DepthStencilCaseUtil::ClearCommand,_std::allocator<deqp::gles2::Functional::DepthStencilCaseUtil::ClearCommand>_>
               *clearCommands,
               vector<deqp::gles2::Functional::DepthStencilCaseUtil::RenderCommand,_std::allocator<deqp::gles2::Functional::DepthStencilCaseUtil::RenderCommand>_>
               *renderCommands)

{
  deUint32 dVar1;
  deUint32 dVar2;
  NotSupportedError *this;
  deUint32 dVar3;
  ulong uVar4;
  long lVar5;
  long lVar6;
  int x1;
  long lVar7;
  int iVar8;
  int iVar9;
  int iVar10;
  int iVar11;
  float depthValues [3];
  int stencilValues [16];
  float local_100 [4];
  undefined1 local_f0 [32];
  float fStack_d0;
  deUint32 local_cc;
  undefined8 local_c8;
  undefined8 uStack_c0;
  undefined8 local_b8;
  bool local_b0;
  deUint32 local_ac;
  float local_a8;
  bool local_a4;
  int local_a0;
  int local_9c;
  deUint32 local_98;
  int local_94;
  float local_90 [4];
  BVec4 local_80;
  deUint32 local_78 [18];
  
  local_f0._8_4_ = target->width;
  dVar3 = local_f0._8_4_ + 3;
  if (-1 < (int)local_f0._8_4_) {
    dVar3 = local_f0._8_4_;
  }
  local_f0._12_4_ = target->height;
  iVar8 = local_f0._12_4_ + 3;
  if (-1 < (int)local_f0._12_4_) {
    iVar8 = local_f0._12_4_;
  }
  if ((0xb < (int)local_f0._8_4_) && (3 < (int)local_f0._12_4_)) {
    iVar8 = iVar8 >> 2;
    dVar2 = (int)local_f0._8_4_ / 0xc;
    local_f0._0_8_ = (pointer)0x0;
    local_f0._16_4_ = 0x4000;
    local_f0._20_4_ = 0.0;
    local_f0._24_4_ = 0.0;
    local_f0._28_4_ = 0.0;
    fStack_d0 = 1.0;
    local_cc = 0;
    std::
    vector<deqp::gles2::Functional::DepthStencilCaseUtil::ClearCommand,_std::allocator<deqp::gles2::Functional::DepthStencilCaseUtil::ClearCommand>_>
    ::emplace_back<deqp::gles2::Functional::DepthStencilCaseUtil::ClearCommand>
              (clearCommands,(ClearCommand *)local_f0);
    iVar9 = target->stencilBits;
    local_78[0] = 0;
    local_78[1] = 1;
    local_78[2] = 2;
    local_78[3] = 3;
    local_78[4] = 4;
    local_78[5] = 5;
    local_78[6] = 6;
    local_78[7] = 7;
    uVar4 = 0xf00000000;
    lVar5 = 0;
    do {
      *(int *)((long)local_78 + (uVar4 >> 0x1e)) = ~(-1 << ((byte)iVar9 & 0x1f)) + (int)lVar5;
      uVar4 = uVar4 - 0x100000000;
      lVar5 = lVar5 + -1;
    } while (lVar5 != -8);
    local_100[0] = -1.0;
    local_100[1] = 0.0;
    local_100[2] = 1.0;
    lVar5 = 0;
    do {
      iVar9 = iVar8 * (int)lVar5;
      iVar11 = 0;
      lVar6 = 0;
      do {
        dVar1 = local_78[lVar5 * 4 + lVar6];
        lVar7 = 0;
        iVar10 = iVar11;
        do {
          local_f0._20_4_ = 0.0;
          local_f0._24_4_ = 0.0;
          local_f0._28_4_ = 0.0;
          fStack_d0 = 0.0;
          local_f0._4_4_ = iVar9;
          local_f0._0_4_ = iVar10;
          local_f0._8_8_ = CONCAT44(iVar8,dVar2);
          local_f0._16_4_ = 0x400;
          local_cc = dVar1;
          std::
          vector<deqp::gles2::Functional::DepthStencilCaseUtil::ClearCommand,_std::allocator<deqp::gles2::Functional::DepthStencilCaseUtil::ClearCommand>_>
          ::emplace_back<deqp::gles2::Functional::DepthStencilCaseUtil::ClearCommand>
                    (clearCommands,(ClearCommand *)local_f0);
          local_f0._0_8_ = local_f0._0_8_ & 0xffffff0000000000;
          local_c8._0_4_ = 0;
          local_c8._4_4_ = 0;
          uStack_c0._0_4_ = 0;
          uStack_c0._4_4_ = 0;
          local_f0._24_4_ = 0.0;
          local_f0._28_4_ = 0.0;
          fStack_d0 = 0.0;
          local_cc = 0;
          local_f0._8_8_ = 0;
          local_f0._16_4_ = 0;
          local_f0._20_4_ = 0.0;
          local_b8._0_4_ = 0;
          local_b8._4_4_ = 0;
          local_90[0] = 0.0;
          local_90[1] = 0.0;
          local_90[2] = 0.0;
          local_90[3] = 0.0;
          local_a8 = local_100[lVar7];
          local_b0 = true;
          local_ac = 0x207;
          local_a4 = true;
          local_80.m_data[0] = false;
          local_80.m_data[1] = false;
          local_80.m_data[2] = false;
          local_80.m_data[3] = false;
          local_a0 = iVar10;
          local_9c = iVar9;
          local_98 = dVar2;
          local_94 = iVar8;
          std::
          vector<deqp::gles2::Functional::DepthStencilCaseUtil::RenderCommand,_std::allocator<deqp::gles2::Functional::DepthStencilCaseUtil::RenderCommand>_>
          ::push_back(renderCommands,(value_type *)local_f0);
          lVar7 = lVar7 + 1;
          iVar10 = iVar10 + dVar2;
        } while (lVar7 != 3);
        lVar6 = lVar6 + 1;
        iVar11 = iVar11 + ((int)dVar3 >> 2);
      } while (lVar6 != 4);
      lVar5 = lVar5 + 1;
    } while (lVar5 != 4);
    return;
  }
  this = (NotSupportedError *)__cxa_allocate_exception(0x38);
  local_f0._0_8_ = local_f0 + 0x10;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_f0,"Too small render target","");
  tcu::NotSupportedError::NotSupportedError(this,(string *)local_f0);
  __cxa_throw(this,&tcu::NotSupportedError::typeinfo,tcu::Exception::~Exception);
}

Assistant:

void generateBaseClearAndDepthCommands (const TestRenderTarget& target, vector<ClearCommand>& clearCommands, vector<RenderCommand>& renderCommands)
{
	DE_ASSERT(clearCommands.empty());
	DE_ASSERT(renderCommands.empty());

	const int		numL0CellsX		= 4;
	const int		numL0CellsY		= 4;
	const int		numL1CellsX		= 3;
	const int		numL1CellsY		= 1;
	int				cellL0Width		= target.width/numL0CellsX;
	int				cellL0Height	= target.height/numL0CellsY;
	int				cellL1Width		= cellL0Width/numL1CellsX;
	int				cellL1Height	= cellL0Height/numL1CellsY;

	int				stencilValues[numL0CellsX*numL0CellsY];
	float			depthValues[numL1CellsX*numL1CellsY];

	if (cellL0Width <= 0 || cellL1Width <= 0 || cellL0Height <= 0 || cellL1Height <= 0)
		throw tcu::NotSupportedError("Too small render target");

	// Fullscreen clear to black.
	clearCommands.push_back(ClearCommand(rr::WindowRectangle(0, 0, target.width, target.height), GL_COLOR_BUFFER_BIT, Vec4(0.0f, 0.0f, 0.0f, 1.0f), 0));

	// Compute stencil values: numL0CellsX*numL0CellsY combinations of lowest and highest bits.
	getStencilTestValues(target.stencilBits, numL0CellsX*numL0CellsY, &stencilValues[0]);

	// Compute depth values
	{
		int		numValues		= DE_LENGTH_OF_ARRAY(depthValues);
		float	depthStep		= 2.0f/(float)(numValues-1);

		for (int ndx = 0; ndx < numValues; ndx++)
			depthValues[ndx] = -1.0f + depthStep*(float)ndx;
	}

	for (int y0 = 0; y0 < numL0CellsY; y0++)
	{
		for (int x0 = 0; x0 < numL0CellsX; x0++)
		{
			int stencilValue = stencilValues[y0*numL0CellsX + x0];

			for (int y1 = 0; y1 < numL1CellsY; y1++)
			{
				for (int x1 = 0; x1 < numL1CellsX; x1++)
				{
					int					x			= x0*cellL0Width + x1*cellL1Width;
					int					y			= y0*cellL0Height + y1*cellL1Height;
					rr::WindowRectangle	cellL1Rect	(x, y, cellL1Width, cellL1Height);

					clearCommands.push_back(ClearCommand(cellL1Rect, GL_STENCIL_BUFFER_BIT, Vec4(0), stencilValue));

					RenderCommand renderCmd;
					renderCmd.params.visibleFace		= rr::FACETYPE_FRONT;
					renderCmd.params.depth				= depthValues[y1*numL1CellsX + x1];;
					renderCmd.params.depthTestEnabled	= true;
					renderCmd.params.depthFunc			= GL_ALWAYS;
					renderCmd.params.depthWriteMask		= true;
					renderCmd.colorMask					= tcu::BVec4(false);
					renderCmd.rect						= cellL1Rect;

					renderCommands.push_back(renderCmd);
				}
			}
		}
	}
}